

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O3

void __thiscall
jessilib::callback_with_iterations::operator()(callback_with_iterations *this,timer *in_timer)

{
  timer_context *this_00;
  __int_type _Var1;
  __int_type _Var2;
  undefined8 uVar3;
  bool bVar4;
  cancel_detector detector;
  cancel_detector cStack_18;
  
  cancel_detector::cancel_detector(&cStack_18,&this->m_cancel_token);
  _Var1 = (this->m_iterations).super___atomic_base<unsigned_long>._M_i;
  do {
    if (_Var1 == 0) goto LAB_00154710;
    LOCK();
    _Var2 = (this->m_iterations).super___atomic_base<unsigned_long>._M_i;
    bVar4 = _Var1 == _Var2;
    if (bVar4) {
      (this->m_iterations).super___atomic_base<unsigned_long>._M_i = _Var1 - 1;
      _Var2 = _Var1;
    }
    UNLOCK();
    _Var1 = _Var2;
  } while (!bVar4);
  if ((this->m_callback).super__Function_base._M_manager == (_Manager_type)0x0) {
    uVar3 = std::__throw_bad_function_call();
    cancel_detector::~cancel_detector(&cStack_18);
    _Unwind_Resume(uVar3);
  }
  (*(this->m_callback)._M_invoker)((_Any_data *)this,in_timer);
  bVar4 = cancel_detector::expired(&cStack_18);
  if (((!bVar4) && ((this->m_iterations).super___atomic_base<unsigned_long>._M_i == 0)) &&
     (this_00 = (in_timer->m_context).
                super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     , this_00 != (timer_context *)0x0)) {
    impl::timer_context::cancel(this_00);
  }
LAB_00154710:
  cancel_detector::~cancel_detector(&cStack_18);
  return;
}

Assistant:

void operator()(timer& in_timer) {
		cancel_detector detector{ m_cancel_token };

		auto iterations = m_iterations.load();
		do {
			// Ensure timer is not already expired
			if (iterations == 0) {
				return;
			}

			// Decrement iterations and cancel if necessary
		} while (!m_iterations.compare_exchange_weak(iterations, iterations - 1));

		// Call callback
		m_callback(in_timer);

		if (!detector.expired()) {
			if (m_iterations == 0) {
				// Cancel the timer
				in_timer.cancel();
			}
		}
	}